

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O0

void __thiscall Chromosome::printCoordinates(Chromosome *this)

{
  bool bVar1;
  reference pCVar2;
  Coordinate local_58 [2];
  undefined8 local_38;
  Coordinate coordinate;
  iterator __end1;
  iterator __begin1;
  vector<Coordinate,_std::allocator<Coordinate>_> *__range1;
  Chromosome *this_local;
  
  __end1 = std::vector<Coordinate,_std::allocator<Coordinate>_>::begin(&this->pathList);
  register0x00000000 = std::vector<Coordinate,_std::allocator<Coordinate>_>::end(&this->pathList);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Coordinate_*,_std::vector<Coordinate,_std::allocator<Coordinate>_>_>
                                *)&coordinate.facing);
    if (!bVar1) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<Coordinate_*,_std::vector<Coordinate,_std::allocator<Coordinate>_>_>
             ::operator*(&__end1);
    coordinate.x = pCVar2->facing;
    local_38._0_4_ = pCVar2->x;
    local_38._4_4_ = pCVar2->y;
    Coordinate::representation_abi_cxx11_(local_58);
    std::operator<<((ostream *)&std::cout,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    __gnu_cxx::
    __normal_iterator<Coordinate_*,_std::vector<Coordinate,_std::allocator<Coordinate>_>_>::
    operator++(&__end1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  return;
}

Assistant:

void Chromosome::printCoordinates() {

    for (auto coordinate : pathList){

        std::cout << coordinate.representation();
    }
    std::cout << "\n";
}